

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::InitializeUI(cmCursesMainForm *this)

{
  pointer pcVar1;
  iterator iVar2;
  pointer ppcVar3;
  bool bVar4;
  CacheEntryType CVar5;
  vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>> *this_00;
  cmCursesCacheEntryComposite *pcVar6;
  cmCursesWidget *this_01;
  int iVar7;
  pointer key_00;
  pointer key_01;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar8;
  string key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  cmCursesCacheEntryComposite *comp;
  string local_78;
  cmCursesCacheEntryComposite *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  cmCursesCacheEntryComposite *local_38;
  
  this_00 = (vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>> *)
            operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  cmState::GetCacheEntryKeys_abi_cxx11_(&local_50,this->CMakeInstance->State);
  std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
  reserve((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
          this_00,(long)local_50.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00220239:
    pcVar6 = (cmCursesCacheEntryComposite *)operator_new(0x40);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"EMPTY CACHE","");
    cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(pcVar6,&local_78,0x1e,0x1e);
    local_38 = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    this_01 = (cmCursesWidget *)operator_new(0x40);
    cmCursesDummyWidget::cmCursesDummyWidget((cmCursesDummyWidget *)this_01,1,1,1,1);
    pcVar6->Entry = this_01;
    iVar2._M_current = *(cmCursesCacheEntryComposite ***)(this_00 + 8);
    if (iVar2._M_current == *(cmCursesCacheEntryComposite ***)(this_00 + 0x10)) {
      std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>::
      _M_realloc_insert<cmCursesCacheEntryComposite*const&>(this_00,iVar2,&local_38);
    }
    else {
      *iVar2._M_current = pcVar6;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  else {
    iVar7 = 0;
    key_00 = local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      CVar5 = cmState::GetCacheEntryType(this->CMakeInstance->State,key_00);
      iVar7 = iVar7 + (uint)(CVar5 + ~UNINITIALIZED < 0xfffffffd);
      key_00 = key_00 + 1;
    } while (key_00 != local_50.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (iVar7 == 0) goto LAB_00220239;
    iVar7 = this->InitialWidth + -0x23;
    key_01 = local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (key_00 != local_50.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      key_00 = local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (key_00->_M_dataplus)._M_p;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar1,pcVar1 + key_00->_M_string_length);
        CVar5 = cmState::GetCacheEntryType(this->CMakeInstance->State,key_00);
        if ((2 < CVar5 - INTERNAL) && (bVar4 = LookForCacheEntry(this,&local_78), !bVar4)) {
          pcVar6 = (cmCursesCacheEntryComposite *)operator_new(0x40);
          cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                    (pcVar6,&local_78,this->CMakeInstance,true,0x1e,iVar7);
          iVar2._M_current = *(cmCursesCacheEntryComposite ***)(this_00 + 8);
          local_58 = pcVar6;
          if (iVar2._M_current == *(cmCursesCacheEntryComposite ***)(this_00 + 0x10)) {
            std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>::
            _M_realloc_insert<cmCursesCacheEntryComposite*>(this_00,iVar2,&local_58);
          }
          else {
            *iVar2._M_current = pcVar6;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          this->OkToGenerate = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        key_00 = key_00 + 1;
        key_01 = local_50.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (key_00 != local_50.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (key_01 != key_00) {
      do {
        pcVar1 = (key_01->_M_dataplus)._M_p;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar1,pcVar1 + key_01->_M_string_length);
        CVar5 = cmState::GetCacheEntryType(this->CMakeInstance->State,key_01);
        if ((2 < CVar5 - INTERNAL) && (bVar4 = LookForCacheEntry(this,&local_78), bVar4)) {
          pcVar6 = (cmCursesCacheEntryComposite *)operator_new(0x40);
          cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                    (pcVar6,&local_78,this->CMakeInstance,false,0x1e,iVar7);
          iVar2._M_current = *(cmCursesCacheEntryComposite ***)(this_00 + 8);
          local_58 = pcVar6;
          if (iVar2._M_current == *(cmCursesCacheEntryComposite ***)(this_00 + 0x10)) {
            std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>::
            _M_realloc_insert<cmCursesCacheEntryComposite*>(this_00,iVar2,&local_58);
          }
          else {
            *iVar2._M_current = pcVar6;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        key_01 = key_01 + 1;
      } while (key_01 != local_50.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  pvVar8 = this->Entries;
  if (pvVar8 != (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    std::
    for_each<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite*const*,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>,false>>
              ((pvVar8->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar8->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    pvVar8 = this->Entries;
    if (pvVar8 != (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   *)0x0) {
      ppcVar3 = (pvVar8->
                super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ppcVar3 != (pointer)0x0) {
        operator_delete(ppcVar3,(long)(pvVar8->
                                      super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppcVar3);
      }
      goto LAB_00220321;
    }
  }
  pvVar8 = (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
           0x0;
LAB_00220321:
  operator_delete(pvVar8,0x18);
  this->Entries =
       (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
       this_00;
  RePost(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  return;
}

Assistant:

void cmCursesMainForm::InitializeUI()
{
  // Create a vector of cmCursesCacheEntryComposite's
  // which contain labels, entries and new entry markers
  std::vector<cmCursesCacheEntryComposite*>* newEntries =
    new std::vector<cmCursesCacheEntryComposite*>;
  std::vector<std::string> cacheKeys =
      this->CMakeInstance->GetState()->GetCacheEntryKeys();
  newEntries->reserve(cacheKeys.size());

  // Count non-internal and non-static entries
  int count=0;

  for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
      it != cacheKeys.end(); ++it)
    {
    cmState::CacheEntryType t = this->CMakeInstance->GetState()
        ->GetCacheEntryType(*it);
    if (t != cmState::INTERNAL &&
        t != cmState::STATIC &&
        t != cmState::UNINITIALIZED)
      {
      ++count;
      }
    }

  int entrywidth = this->InitialWidth - 35;

  cmCursesCacheEntryComposite* comp;
  if ( count == 0 )
    {
    // If cache is empty, display a label saying so and a
    // dummy entry widget (does not respond to input)
    comp = new cmCursesCacheEntryComposite("EMPTY CACHE", 30, 30);
    comp->Entry = new cmCursesDummyWidget(1, 1, 1, 1);
    newEntries->push_back(comp);
    }
  else
    {
    // Create the composites.

    // First add entries which are new
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (!this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          true, 30,
                                                          entrywidth));
        this->OkToGenerate = false;
        }
      }

    // then add entries which are old
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          false, 30,
                                                          entrywidth));
        }
      }
    }

  // Clean old entries
  if (this->Entries)
    {
    cmDeleteAll(*this->Entries);
    }
  delete this->Entries;
  this->Entries = newEntries;

  // Compute fields from composites
  this->RePost();
}